

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O1

void __thiscall despot::Logger::PrintStatistics(Logger *this,int num_runs)

{
  pointer pdVar1;
  pointer pdVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nCompleted ",0xb);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,num_runs);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," run(s).",8);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Average total discounted reward (stderr) = ",0x2b);
  pdVar1 = (this->discounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar2 = (this->discounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pdVar2 - (long)pdVar1 >> 3;
  dVar8 = 0.0;
  if (pdVar2 != pdVar1) {
    lVar5 = 0;
    do {
      dVar8 = dVar8 + pdVar1[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  dVar9 = 0.0;
  if (pdVar2 != pdVar1) {
    auVar6._8_4_ = (int)((long)pdVar2 - (long)pdVar1 >> 0x23);
    auVar6._0_8_ = lVar4;
    auVar6._12_4_ = 0x45300000;
    dVar9 = dVar8 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
  }
  poVar3 = std::ostream::_M_insert<double>(dVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
  dVar8 = StderrDiscountedRoundReward(this);
  poVar3 = std::ostream::_M_insert<double>(dVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Average total undiscounted reward (stderr) = ",0x2d);
  pdVar1 = (this->undiscounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar2 = (this->undiscounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pdVar2 - (long)pdVar1 >> 3;
  dVar8 = 0.0;
  if (pdVar2 != pdVar1) {
    lVar5 = 0;
    do {
      dVar8 = dVar8 + pdVar1[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  dVar9 = 0.0;
  if (pdVar2 != pdVar1) {
    auVar7._8_4_ = (int)((long)pdVar2 - (long)pdVar1 >> 0x23);
    auVar7._0_8_ = lVar4;
    auVar7._12_4_ = 0x45300000;
    dVar9 = dVar8 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
  }
  poVar3 = std::ostream::_M_insert<double>(dVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
  dVar8 = StderrUndiscountedRoundReward(this);
  poVar3 = std::ostream::_M_insert<double>(dVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void Logger::PrintStatistics(int num_runs) {
	cout << "\nCompleted " << num_runs << " run(s)." << endl;
	cout << "Average total discounted reward (stderr) = "
			<< AverageDiscountedRoundReward() << " ("
			<< StderrDiscountedRoundReward() << ")" << endl;
	cout << "Average total undiscounted reward (stderr) = "
			<< AverageUndiscountedRoundReward() << " ("
			<< StderrUndiscountedRoundReward() << ")" << endl;
}